

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple.cpp
# Opt level: O0

void __thiscall
iu_DISABLED_TestFailure_x_iutest_x_Subroutine1_Test::Body
          (iu_DISABLED_TestFailure_x_iutest_x_Subroutine1_Test *this)

{
  iuStreamMessage *piVar1;
  iuStreamMessage local_388;
  iuStreamMessage local_200;
  iuCodeMessage local_78;
  undefined1 local_48 [8];
  ScopedMessage scoped_message_2;
  int x;
  iu_DISABLED_TestFailure_x_iutest_x_Subroutine1_Test *this_local;
  
  scoped_message_2.super_iuCodeMessage._44_4_ = 100;
  iutest::detail::iuStreamMessage::iuStreamMessage(&local_200);
  iutest::detail::iuStreamMessage::iuStreamMessage(&local_388);
  piVar1 = iutest::detail::iuStreamMessage::operator<<(&local_388,(char (*) [13])"routine1. x=");
  piVar1 = iutest::detail::iuStreamMessage::operator<<
                     (piVar1,(int *)&scoped_message_2.super_iuCodeMessage.field_0x2c);
  piVar1 = iutest::detail::iuStreamMessage::operator<<(&local_200,piVar1);
  iutest::detail::iuCodeMessage::iuCodeMessage
            (&local_78,
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/samples/simple.cpp"
             ,0x7c,piVar1);
  iutest::AssertionHelper::ScopedMessage::ScopedMessage((ScopedMessage *)local_48,&local_78);
  iutest::detail::iuCodeMessage::~iuCodeMessage(&local_78);
  iutest::detail::iuStreamMessage::~iuStreamMessage(&local_388);
  iutest::detail::iuStreamMessage::~iuStreamMessage(&local_200);
  Sub1(scoped_message_2.super_iuCodeMessage._44_4_);
  iutest::AssertionHelper::ScopedMessage::~ScopedMessage((ScopedMessage *)local_48);
  Sub1(3);
  return;
}

Assistant:

IUTEST(DISABLED_TestFailure, Subroutine1)
{
    {
        int x=100;
        IUTEST_SCOPED_TRACE(::iutest::Message() << "routine1. x=" << x);

        Sub1(x);
    }
    // ここの失敗には "routine1." のメッセージは表示されません。
    Sub1(3);
}